

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::polynomial_multiplier<double,_4,_2,_1>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = binomial(6,2);
  iVar2 = binomial(5,1);
  polynomial_multiplier<double,_3,_2,_0>::mul(dst + iVar1,p1 + iVar2,m2);
  polynomial_multiplier<double,_3,_2,_1>::mul_monomial(dst + iVar1,p1 + iVar2,m2 + 1);
  polynomial_multiplier<double,_4,_1,_1>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }